

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O3

void __thiscall AutoArgParse::FlagStore::parse(FlagStore *this,ArgIter *first,ArgIter *last)

{
  pointer puVar1;
  ArgBase *pAVar2;
  pointer pcVar3;
  bool bVar4;
  MissingMandatoryArgException *this_00;
  UnexpectedArgException *pUVar5;
  int iVar6;
  pointer_____offset_0x10___ *ppuVar7;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar8;
  int iVar9;
  Policy local_74;
  string local_70;
  string local_50;
  
  if (first->_M_current == last->_M_current) {
    iVar9 = 0;
    iVar6 = 0;
LAB_001084bb:
    if (iVar9 == this->_numberMandatoryFlags) {
      if (iVar6 == this->_numberMandatoryArgs) {
        return;
      }
      if (first->_M_current != last->_M_current) {
        pUVar5 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar3 = (first->_M_current->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + first->_M_current->_M_string_length);
        UnexpectedArgException::UnexpectedArgException(pUVar5,&local_70,this);
        __cxa_throw(pUVar5,&UnexpectedArgException::typeinfo,
                    UnexpectedArgException::~UnexpectedArgException);
      }
      this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
      MissingMandatoryArgException::MissingMandatoryArgException(this_00,this);
      ppuVar7 = &MissingMandatoryArgException::typeinfo;
    }
    else {
      if (first->_M_current != last->_M_current) {
        pUVar5 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (first->_M_current->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + first->_M_current->_M_string_length);
        UnexpectedArgException::UnexpectedArgException(pUVar5,&local_50,this);
        __cxa_throw(pUVar5,&UnexpectedArgException::typeinfo,
                    UnexpectedArgException::~UnexpectedArgException);
      }
      this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
      MissingMandatoryFlagException::MissingMandatoryFlagException
                ((MissingMandatoryFlagException *)this_00,this);
      ppuVar7 = &MissingMandatoryFlagException::typeinfo;
    }
    __cxa_throw(this_00,ppuVar7,ParseException::~ParseException);
  }
  iVar6 = 0;
  iVar9 = 0;
LAB_0010841f:
  bVar4 = tryParseFlag(this,first,last,&local_74);
  if (!bVar4) {
    puVar8 = (this->args).
             super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->args).
             super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar8 == puVar1) goto LAB_001084bb;
      pAVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
      if ((pAVar2->super_ParseToken)._parsed == false) {
        (**(code **)((long)(pAVar2->super_ParseToken)._vptr_ParseToken + 0x10))(pAVar2,first,last);
        pAVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                 .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
        if ((pAVar2->super_ParseToken)._parsed != false) goto LAB_00108486;
      }
      puVar8 = puVar8 + 1;
    } while( true );
  }
  iVar9 = iVar9 + (uint)(local_74 == MANDATORY);
  goto LAB_0010849c;
LAB_00108486:
  iVar6 = iVar6 + (uint)((pAVar2->super_ParseToken).policy == MANDATORY);
LAB_0010849c:
  if (first->_M_current == last->_M_current) goto LAB_001084bb;
  goto LAB_0010841f;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::parse(ArgIter& first, ArgIter& last) {
    int numberParsedMandatoryFlags = 0;
    int numberParsedMandatoryArgs = 0;
    while (first != last) {
        Policy foundPolicy;
        if (tryParseFlag(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryFlags++;
            }
        } else if (tryParseArg(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryArgs++;
            }
        } else {
            break;
        }
    }
    if (numberParsedMandatoryFlags != _numberMandatoryFlags) {
        if (first == last) {
            throw MissingMandatoryFlagException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
    if (numberParsedMandatoryArgs != _numberMandatoryArgs) {
        if (first == last) {
            throw MissingMandatoryArgException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
}